

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O2

void __thiscall gms_matcher::SetScale(gms_matcher *this,int Scale)

{
  Size SVar1;
  int iVar2;
  int iVar3;
  long *local_178 [44];
  
  iVar2 = (int)(mScaleRatios[Scale] * (double)(this->mGridSizeLeft).width);
  iVar3 = (int)(mScaleRatios[Scale] * (double)(this->mGridSizeLeft).height);
  SVar1.height = iVar3;
  SVar1.width = iVar2;
  this->mGridSizeRight = SVar1;
  iVar3 = iVar3 * iVar2;
  this->mGridNumberRight = iVar3;
  cv::Mat::zeros((int)local_178,iVar3,9);
  (**(code **)(*local_178[0] + 0x18))
            (local_178[0],local_178,&this->mGridNeighborRight,0xffffffffffffffff);
  cv::MatExpr::~MatExpr((MatExpr *)local_178);
  InitalizeNiehbors(this,&this->mGridNeighborRight,&this->mGridSizeRight);
  return;
}

Assistant:

void SetScale(int Scale) {
		// Set Scale
		mGridSizeRight.width = mGridSizeLeft.width  * mScaleRatios[Scale];
		mGridSizeRight.height = mGridSizeLeft.height * mScaleRatios[Scale];
		mGridNumberRight = mGridSizeRight.width * mGridSizeRight.height;

		// Initialize the neihbor of right grid 
		mGridNeighborRight = Mat::zeros(mGridNumberRight, 9, CV_32SC1);
		InitalizeNiehbors(mGridNeighborRight, mGridSizeRight);
	}